

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall Js::CompoundString::TakeOwnershipOfLastBlock(CompoundString *this)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Block *pBVar4;
  
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c5,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00a07f4e;
    *puVar3 = 0;
  }
  if (this->ownsLastBlock == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c6,"(!OwnsLastBlock())","!OwnsLastBlock()");
    if (!bVar2) {
LAB_00a07f4e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pBVar4 = (this->lastBlock).ptr;
  if (pBVar4 != (Block *)0x0) {
    recycler = ((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.ptr
                 )->javascriptLibrary).ptr)->recycler;
    pBVar4 = Block::Clone(pBVar4,(this->lastBlockInfo).charLength,recycler);
    pBVar4 = Block::Chain(pBVar4,recycler);
    BlockInfo::CopyFrom(&this->lastBlockInfo,pBVar4);
    this->ownsLastBlock = true;
    Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierSet(&this->lastBlock,pBVar4);
    return;
  }
  pBVar4 = BlockInfo::Resize(&this->lastBlockInfo,
                             ((((this->super_LiteralString).super_JavascriptString.
                                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->recycler)
  ;
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierSet(&this->lastBlock,pBVar4);
  this->ownsLastBlock = true;
  return;
}

Assistant:

void CompoundString::TakeOwnershipOfLastBlock()
    {
        Assert(!IsFinalized());
        Assert(!OwnsLastBlock());

        // Another string object owns the last block's buffer. The buffer must be copied, or another block must be chained.

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            ownsLastBlock = true;
            return;
        }

        // The last block is already in a chain, or is over the threshold to resize. Shallow-clone the last block (clone
        // just its metadata, while still pointing to the original buffer), and chain it to a new last block.
        Recycler *const recycler = GetLibrary()->GetRecycler();
        Block *const newLastBlock = lastBlock->Clone(LastBlockCharLength(), recycler)->Chain(recycler);
        lastBlockInfo.CopyFrom(newLastBlock);
        ownsLastBlock = true;
        this->lastBlock = newLastBlock;
    }